

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool imageExists(string *rootDir,string *imageId)

{
  __type_conflict1 _Var1;
  undefined1 __lhs [8];
  pointer pIVar2;
  long lVar3;
  pointer pIVar4;
  long lVar5;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  undefined1 local_90 [8];
  vector<Image,_std::allocator<Image>_> images;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  
  getContainerImages((vector<Image,_std::allocator<Image>_> *)local_90,rootDir);
  std::__cxx11::string::string
            ((string *)
             &images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)imageId);
  std::__cxx11::string::string
            (local_b0,(string *)
                      &images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string(local_d0,local_b0);
  std::__cxx11::string::string(local_f0,local_d0);
  std::__cxx11::string::string((string *)&local_58,local_f0);
  std::__cxx11::string::string(local_110,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,local_110);
  local_38 = images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar3 = (long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_90;
  __lhs = local_90;
  for (lVar5 = lVar3 / 0x48 >> 2; pIVar4 = local_38, 0 < lVar5; lVar5 = lVar5 + -1) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,&local_58);
    pIVar2 = (pointer)__lhs;
    pIVar4 = local_38;
    if (_Var1) goto LAB_0010b095;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)__lhs + 0x48),&local_58);
    pIVar2 = (pointer)((long)__lhs + 0x48);
    pIVar4 = local_38;
    if (_Var1) goto LAB_0010b095;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)__lhs + 0x90),&local_58);
    pIVar2 = (pointer)((long)__lhs + 0x90);
    pIVar4 = local_38;
    if (_Var1) goto LAB_0010b095;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)__lhs + 0xd8),&local_58);
    pIVar2 = (pointer)((long)__lhs + 0xd8);
    pIVar4 = local_38;
    if (_Var1) goto LAB_0010b095;
    __lhs = (undefined1  [8])((long)__lhs + 0x120);
    lVar3 = lVar3 + -0x120;
  }
  lVar3 = lVar3 / 0x48;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pIVar2 = pIVar4;
      if ((lVar3 != 3) ||
         (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,&local_58), pIVar2 = (pointer)__lhs, _Var1))
      goto LAB_0010b095;
      __lhs = (undefined1  [8])((long)__lhs + 0x48);
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,&local_58);
    pIVar2 = (pointer)__lhs;
    if (_Var1) goto LAB_0010b095;
    __lhs = (undefined1  [8])((long)__lhs + 0x48);
  }
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs
                          ,&local_58);
  pIVar2 = (pointer)__lhs;
  if (!_Var1) {
    pIVar2 = pIVar4;
  }
LAB_0010b095:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string
            ((string *)
             &images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Image,_std::allocator<Image>_>::~vector
            ((vector<Image,_std::allocator<Image>_> *)local_90);
  return pIVar2 != pIVar4;
}

Assistant:

bool imageExists(const std::string& rootDir, const std::string& imageId)
{
    auto images = getContainerImages(rootDir);
    return std::any_of(images.cbegin(), images.cend(),
                       [imageId](const Image& image) { return image.id == imageId; });
}